

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::setDefaultPrecision
          (TParseContext *this,TSourceLoc *loc,TPublicType *publicType,TPrecisionQualifier qualifier
          )

{
  TBasicType t;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  TBasicType basicType;
  TPrecisionQualifier qualifier_local;
  TPublicType *publicType_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  t = publicType->basicType;
  if (t == EbtSampler) {
    iVar2 = computeSamplerTypeIndex(this,&publicType->sampler);
    this->defaultSamplerPrecision[iVar2] = qualifier;
  }
  else if (((t == EbtInt) || (t == EbtFloat)) && (bVar1 = TPublicType::isScalar(publicType), bVar1))
  {
    this->defaultPrecision[t] = qualifier;
    if (t == EbtInt) {
      this->defaultPrecision[9] = qualifier;
      TPrecisionManager::explicitIntDefaultSeen(&this->precisionManager);
    }
    else {
      TPrecisionManager::explicitFloatDefaultSeen(&this->precisionManager);
    }
  }
  else if (t == EbtAtomicUint) {
    if (qualifier != EpqHigh) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply highp to atomic_uint","precision","");
    }
  }
  else {
    pcVar3 = TType::getBasicString(t);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,
               "cannot apply precision statement to this type; use \'float\', \'int\' or a sampler type"
               ,pcVar3,"");
  }
  return;
}

Assistant:

void TParseContext::setDefaultPrecision(const TSourceLoc& loc, TPublicType& publicType, TPrecisionQualifier qualifier)
{
    TBasicType basicType = publicType.basicType;

    if (basicType == EbtSampler) {
        defaultSamplerPrecision[computeSamplerTypeIndex(publicType.sampler)] = qualifier;

        return;  // all is well
    }

    if (basicType == EbtInt || basicType == EbtFloat) {
        if (publicType.isScalar()) {
            defaultPrecision[basicType] = qualifier;
            if (basicType == EbtInt) {
                defaultPrecision[EbtUint] = qualifier;
                precisionManager.explicitIntDefaultSeen();
            } else
                precisionManager.explicitFloatDefaultSeen();

            return;  // all is well
        }
    }

    if (basicType == EbtAtomicUint) {
        if (qualifier != EpqHigh)
            error(loc, "can only apply highp to atomic_uint", "precision", "");

        return;
    }

    error(loc, "cannot apply precision statement to this type; use 'float', 'int' or a sampler type", TType::getBasicString(basicType), "");
}